

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDivConstant.cpp
# Opt level: O1

void TPZShapeHDivConstant<pzshape::TPZShapePrism>::Initialize
               (TPZVec<long> *ids,TPZVec<int> *connectorders,TPZVec<int> *sideorient,
               TPZShapeData *data)

{
  ulong uVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar7 [16];
  TPZManVector<int,_15> locconorders;
  undefined4 uStack_b4;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  ulong uStack_98;
  ulong local_90;
  int local_88 [20];
  TPZVec<long> *local_38;
  long lVar6;
  
  stack0xffffffffffffff60 = (undefined1  [16])0x0;
  local_90 = 0;
  local_a8._0_8_ = &PTR__TPZManVector_01840040;
  uVar1 = sideorient->fNElements;
  local_38 = ids;
  if ((long)uVar1 < 0x15) {
    local_a8._8_8_ = local_88;
    local_90 = 0;
  }
  else {
    uStack_b0 = 0x101d8e8;
    local_a8._8_8_ = operator_new__(-(ulong)(uVar1 >> 0x3e != 0) | uVar1 * 4);
    local_90 = uVar1;
  }
  if (0 < (long)uVar1) {
    piVar2 = sideorient->fStore;
    uVar4 = 0;
    do {
      *(int *)(local_a8._8_8_ + uVar4 * 4) = piVar2[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  uStack_b0 = 0x101d92b;
  uStack_98 = uVar1;
  TPZManVector<int,_20>::operator=(&data->fSideOrient,(TPZManVector<int,_20> *)local_a8);
  if ((int *)local_a8._8_8_ == local_88) {
    local_a8._8_8_ = (int *)0x0;
  }
  local_90 = 0;
  local_a8._0_8_ = &PTR__TPZVec_0183b5b0;
  if ((int *)local_a8._8_8_ != (int *)0x0) {
    uStack_b0 = 0x101d966;
    operator_delete__((void *)local_a8._8_8_);
  }
  uStack_b0 = 0x101d977;
  TPZManVector<int,_27>::Resize(&data->fHDivConnectOrders,6);
  uStack_b0 = 0x101d988;
  TPZManVector<int,_27>::Resize(&data->fHDivNumConnectShape,6);
  uStack_b0 = 0x101d995;
  TPZVec<int>::TPZVec((TPZVec<int> *)local_a8,0);
  local_a8._0_8_ = &PTR__TPZManVector_018e5218;
  uStack_98 = 0xf;
  local_90 = 0;
  lVar3 = 0xb;
  auVar5 = _DAT_014f8b30;
  auVar7 = _DAT_014f8340;
  do {
    if (SUB164(auVar7 ^ _DAT_014f8350,4) == -0x80000000 &&
        SUB164(auVar7 ^ _DAT_014f8350,0) < -0x7ffffff1) {
      (&uStack_b4)[lVar3] = 1;
      *(undefined4 *)((long)&uStack_b0 + lVar3 * 4) = 1;
    }
    if (SUB164(auVar5 ^ _DAT_014f8350,4) == -0x80000000 &&
        SUB164(auVar5 ^ _DAT_014f8350,0) < -0x7ffffff1) {
      *(undefined4 *)((long)&uStack_b0 + lVar3 * 4 + 4) = 1;
      *(undefined4 *)(local_a8 + lVar3 * 4) = 1;
    }
    lVar6 = auVar7._8_8_;
    auVar7._0_8_ = auVar7._0_8_ + 4;
    auVar7._8_8_ = lVar6 + 4;
    lVar6 = auVar5._8_8_;
    auVar5._0_8_ = auVar5._0_8_ + 4;
    auVar5._8_8_ = lVar6 + 4;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x1b);
  piVar2 = connectorders->fStore;
  lVar3 = 0;
  do {
    local_88[lVar3 + 9] = piVar2[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 6);
  uStack_b0 = 0x101daa9;
  local_a8._8_8_ = local_88;
  TPZShapeHCurlNoGrads<pzshape::TPZShapePrism>::Initialize(local_38,(TPZVec<int> *)local_a8,data);
  if ((int *)local_a8._8_8_ == local_88) {
    local_a8._8_8_ = (int *)0x0;
  }
  local_90 = 0;
  local_a8._0_8_ = &PTR__TPZVec_0183b5b0;
  if ((int *)local_a8._8_8_ != (int *)0x0) {
    uStack_b0 = 0x101dad9;
    operator_delete__((void *)local_a8._8_8_);
  }
  return;
}

Assistant:

void TPZShapeHDivConstant<TSHAPE>::Initialize(TPZVec<int64_t> &ids,
                TPZVec<int> &connectorders,
                const TPZVec<int>& sideorient, 
                TPZShapeData &data)
{
    data.fSideOrient = sideorient;
    data.fHDivConnectOrders.Resize(TSHAPE::NFacets+1);
    data.fHDivNumConnectShape.Resize(TSHAPE::NFacets+1);
    if(TSHAPE::Dimension == 2)
    {
        //Compatibilize the polynomial order
        int conSize = connectorders.size();
        for (int i = 0; i < conSize; i++){
            connectorders[i]++;
        }
        if (TSHAPE::Type() == ETriangle){
            connectorders[conSize-1]++;
        }
        //Initialize data structures
        TPZShapeH1<TSHAPE>::Initialize(ids,connectorders,data);

        for(int ic = 0; ic<TSHAPE::NFacets;ic++)
        {
            data.fHDivConnectOrders[ic] =  connectorders[ic];
            data.fHDivNumConnectShape[ic] = data.fH1NumConnectShape[ic]+1;
        }
        int ic = TSHAPE::NFacets;
        data.fHDivConnectOrders[ic] =  connectorders[ic];
        data.fHDivNumConnectShape[ic] = data.fH1NumConnectShape[ic];
    }
    else
    {
        //Compatibilize the polynomial order
        if (TSHAPE::Type() == ETetraedro) {
            int conSize = connectorders.size();
            for (int i = 0; i < conSize; i++){
                connectorders[i]++;
            }
            connectorders[conSize-1]++;
        }

        const int nedges = TSHAPE::NSides-TSHAPE::NFacets-TSHAPE::NCornerNodes-1;
        TPZManVector<int,15> locconorders(TSHAPE::NSides-TSHAPE::NCornerNodes,1);
        for(int ic = nedges; ic<TSHAPE::NSides-TSHAPE::NCornerNodes; ic++)
        {
            locconorders[ic] = connectorders[ic-nedges];
        }
        TPZShapeHCurlNoGrads<TSHAPE>::Initialize(ids, locconorders, data);
//        TPZManVector<int> HCurlNumConnectShapeF = data.fHDivNumConnectShape;
//        data.fHDivNumConnectShape.Resize(TSHAPE::NFacets+1);
//        for(int ic=nedges; ic<TSHAPE::NSides-TSHAPE::NCornerNodes-1; ic++)
//        {
//            int numshape = HCurlNumConnectShapeF[ic]+1;
//            data.fHDivNumConnectShape[ic-nedges] = numshape;
//        }
//        int ic = TSHAPE::NSides-TSHAPE::NCornerNodes-1;
//        int numshape = HCurlNumConnectShapeF[ic];
//        data.fHDivNumConnectShape[ic-nedges] = numshape;
    }
}